

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m2v_copy_submat(m2v *A,int A_row_offs,int A_col_offs,int n_row,int n_col,m2v *At,
                    int At_row_offs,int At_col_offs)

{
  int val;
  int in_ECX;
  int in_R8D;
  m2v *in_R9;
  int c;
  int r;
  int c_00;
  int r_00;
  
  for (r_00 = 0; r_00 < in_ECX; r_00 = r_00 + 1) {
    for (c_00 = 0; c_00 < in_R8D; c_00 = c_00 + 1) {
      val = c_00 + c;
      m2v_get_el(in_R9,r_00,c_00);
      m2v_set_el(in_R9,r_00,c_00,val);
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_copy_submat)(const MV_GEN_TYPE* A,
				int A_row_offs,
				int A_col_offs,
				int n_row,
				int n_col,
				MV_GEN_TYPE* At,
				int At_row_offs,
				int At_col_offs)
{
	assert(0 <= n_row);
	assert(0 <= n_col);

	assert(0 <= A_row_offs);
	assert(0 <= A_col_offs);
	assert(A_row_offs + n_row <= A->n_row);
	assert(A_col_offs + n_col <= A->n_col);

	assert(0 <= At_row_offs);
	assert(0 <= At_col_offs);
	assert(At_row_offs + n_row <= At->n_row);
	assert(At_col_offs + n_col <= At->n_col);

	for (int r = 0; r < n_row; ++r) {
		for (int c = 0; c < n_col; ++c) {
			MV_GEN_N(_set_el)(At,
			  r + At_row_offs,
			  c + At_col_offs,
			  MV_GEN_N(_get_el)(A, r + A_row_offs, c + A_col_offs));
		}
	}
}